

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dae.cpp
# Opt level: O0

Version __thiscall opencollada::Dae::getVersion(Dae *this)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string root_namespace;
  string local_30 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  Version local_4;
  
  XmlDoc::getRootNamespace_abi_cxx11_((XmlDoc *)root_namespace._0_8_);
  GetColladaNamespace141_abi_cxx11_();
  _Var1 = ::std::operator==(in_RDI,in_stack_ffffffffffffffe8);
  if (_Var1) {
    local_4 = COLLADA14;
  }
  else {
    GetColladaNamespace15_abi_cxx11_();
    _Var1 = ::std::operator==(in_RDI,in_stack_ffffffffffffffe8);
    if (_Var1) {
      local_4 = COLLADA15;
    }
    else {
      local_4 = Unknown;
    }
  }
  ::std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

Dae::Version Dae::getVersion() const
	{
		string root_namespace = getRootNamespace();
		if (root_namespace == Dae::GetColladaNamespace141())
			return Version::COLLADA14;
		else if (root_namespace == Dae::GetColladaNamespace15())
			return Version::COLLADA15;
		return Version::Unknown;
	}